

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519.c
# Opt level: O2

void ed25519_sign(uchar *m,size_t mlen,uchar *sk,uchar *pk,uchar *RS)

{
  bignum256modm_element_t *s;
  bignum256modm r;
  hash_512bits extsk;
  bignum256modm a;
  bignum256modm S;
  hash_512bits hram;
  hash_512bits hashr;
  ge25519 R;
  ed25519_hash_context ctx;
  
  SHA512(sk,0x20,extsk);
  extsk[0] = extsk[0] & 0xf8;
  extsk[0x1f] = extsk[0x1f] & 0x3f | 0x40;
  SHA512_Init((SHA512_CTX *)&ctx);
  SHA512_Update((SHA512_CTX *)&ctx,extsk + 0x20,0x20);
  SHA512_Update((SHA512_CTX *)&ctx,m,mlen);
  SHA512_Final(hashr,(SHA512_CTX *)&ctx);
  expand256_modm(r,hashr,0x40);
  ge25519_scalarmult_base_niels(&R,(uint8_t (*) [96])r,s);
  ge25519_pack(RS,&R);
  ed25519_hram(hram,RS,pk,m,mlen);
  expand256_modm(S,hram,0x40);
  expand256_modm(a,extsk,0x20);
  mul256_modm(S,S,a);
  add256_modm(S,S,r);
  U64TO8_LE(RS + 0x20,S[1] << 0x38 | S[0]);
  U64TO8_LE(RS + 0x28,S[2] << 0x30 | S[1] >> 8);
  U64TO8_LE(RS + 0x30,S[3] << 0x28 | S[2] >> 0x10);
  U64TO8_LE(RS + 0x38,S[4] << 0x20 | S[3] >> 0x18);
  return;
}

Assistant:

ge25519 ALIGN(16) R;
	hash_512bits extsk, hashr, hram;

	ed25519_extsk(extsk, sk);

	/* r = H(aExt[32..64], m) */
	ed25519_hash_init(&ctx);
	ed25519_hash_update(&ctx, extsk + 32, 32);
	ed25519_hash_update(&ctx, m, mlen);
	ed25519_hash_final(&ctx, hashr);
	expand256_modm(r, hashr, 64);

	/* R = rB */
	ge25519_scalarmult_base_niels(&R, ge25519_niels_base_multiples, r);
	ge25519_pack(RS, &R);

	/* S = H(R,A,m).. */
	ed25519_hram(hram, RS, pk, m, mlen);
	expand256_modm(S, hram, 64);

	/* S = H(R,A,m)a */
	expand256_modm(a, extsk, 32);
	mul256_modm(S, S, a);

	/* S = (r + H(R,A,m)a) */
	add256_modm(S, S, r);

	/* S = (r + H(R,A,m)a) mod L */	
	contract256_modm(RS + 32, S);
}

int
ED25519_FN(ed25519_sign_open) (const unsigned char *m, size_t mlen, const ed25519_public_key pk, const ed25519_signature RS) {
	ge25519 ALIGN(16) R, A;
	hash_512bits hash;
	bignum256modm hram, S;
	unsigned char checkR[32];

	if ((RS[63] & 224) || !ge25519_unpack_negative_vartime(&A, pk))
		return -1;

	/* hram = H(R,A,m) */
	ed25519_hram(hash, RS, pk, m, mlen);
	expand256_modm(hram, hash, 64);

	/* S */
	expand256_modm(S, RS + 32, 32);

	/* SB - H(R,A,m)A */
	ge25519_double_scalarmult_vartime(&R, &A, hram, S);
	ge25519_pack(checkR, &R);

	/* check that R = SB - H(R,A,m)A */
	return ed25519_verify(RS, checkR, 32) ? 0 : -1;
}